

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O1

void * gotcha_realloc(void *buffer,size_t size)

{
  malloc_link_t *pmVar1;
  size_t sVar2;
  void *pvVar3;
  malloc_link_t *alloc;
  size_t sVar4;
  
  if (*(ulong *)((long)buffer + -8) < size) {
    pvVar3 = gotcha_malloc(size);
    if (pvVar3 == (void *)0x0) {
      buffer = (void *)0x0;
    }
    else {
      pmVar1 = (malloc_link_t *)((long)buffer + -8);
      sVar2 = (pmVar1->header).size;
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          *(undefined1 *)((long)pvVar3 + sVar4) = *(undefined1 *)((long)buffer + sVar4);
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
      *(malloc_link_t **)buffer = free_list;
      buffer = pvVar3;
      free_list = pmVar1;
    }
  }
  return buffer;
}

Assistant:

void *gotcha_realloc(void* buffer, size_t size) 
{
   void *newbuffer;
   malloc_link_t *alloc;

   alloc = (malloc_link_t *) (((malloc_header_t *) buffer) - 1);

   if (size <= alloc->header.size)
      return buffer;

   newbuffer = gotcha_malloc(size);
   if (!newbuffer)
      return NULL;
   gotcha_memcpy(newbuffer, buffer, alloc->header.size);

   gotcha_free(buffer);

   return newbuffer;
}